

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateDirectory.cxx
# Opt level: O1

void __thiscall cmStateDirectory::ComputeRelativePathTopBinary(cmStateDirectory *this)

{
  bool bVar1;
  int iVar2;
  PointerType pBVar3;
  cmStateSnapshot *this_00;
  cmStateSnapshot snapshot;
  string result;
  string currentBinary;
  allocator local_d9;
  cmStateSnapshot *local_d8;
  iterator iStack_d0;
  cmStateSnapshot *local_c8;
  cmStateDirectory *local_c0;
  cmStateSnapshot local_b8;
  string local_98;
  undefined1 local_78 [40];
  string local_50;
  
  local_b8.Position.Position = (this->Snapshot_).Position.Position;
  local_b8.State = (this->Snapshot_).State;
  local_b8.Position.Tree = (this->Snapshot_).Position.Tree;
  local_d8 = (cmStateSnapshot *)0x0;
  iStack_d0._M_current = (cmStateSnapshot *)0x0;
  local_c8 = (cmStateSnapshot *)0x0;
  local_c0 = this;
  std::vector<cmStateSnapshot,std::allocator<cmStateSnapshot>>::
  _M_realloc_insert<cmStateSnapshot_const&>
            ((vector<cmStateSnapshot,std::allocator<cmStateSnapshot>> *)&local_d8,(iterator)0x0,
             &local_b8);
  do {
    while( true ) {
      cmStateSnapshot::GetBuildsystemDirectoryParent((cmStateSnapshot *)local_78,&local_b8);
      local_b8.Position.Position = local_78._16_8_;
      local_b8.State = (cmState *)local_78._0_8_;
      local_b8.Position.Tree = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)local_78._8_8_;
      bVar1 = cmStateSnapshot::IsValid(&local_b8);
      if (!bVar1) {
        cmStateSnapshot::GetDirectory((cmStateDirectory *)local_78,local_d8);
        pBVar3 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                           ((iterator *)local_78);
        std::__cxx11::string::string
                  ((string *)&local_98,(pBVar3->OutputLocation)._M_dataplus._M_p,
                   (allocator *)&local_50);
        this_00 = local_d8 + 1;
        if (this_00 != iStack_d0._M_current) {
          do {
            cmStateSnapshot::GetDirectory((cmStateDirectory *)local_78,this_00);
            pBVar3 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::
                     operator->((iterator *)local_78);
            std::__cxx11::string::string
                      ((string *)&local_50,(pBVar3->OutputLocation)._M_dataplus._M_p,&local_d9);
            bVar1 = cmsys::SystemTools::IsSubDirectory(&local_98,&local_50);
            if (bVar1) {
              std::__cxx11::string::_M_assign((string *)&local_98);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
            this_00 = this_00 + 1;
          } while (this_00 != iStack_d0._M_current);
        }
        bVar1 = true;
        if (1 < local_98._M_string_length) {
          std::__cxx11::string::substr((ulong)local_78,(ulong)&local_98);
          iVar2 = std::__cxx11::string::compare(local_78);
          bVar1 = iVar2 != 0;
          if ((cmState *)local_78._0_8_ != (cmState *)(local_78 + 0x10)) {
            operator_delete((void *)local_78._0_8_,
                            (ulong)&(((map<cmProperty::ScopeType,_cmPropertyDefinitionMap,_std::less<cmProperty::ScopeType>,_std::allocator<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>_>
                                       *)local_78._16_8_)->_M_t)._M_impl.field_0x1);
          }
        }
        if (bVar1) {
          pBVar3 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                             (&local_c0->DirectoryState);
          std::__cxx11::string::_M_assign((string *)&pBVar3->RelativePathTopBinary);
        }
        else {
          pBVar3 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                             (&local_c0->DirectoryState);
          std::__cxx11::string::_M_replace
                    ((ulong)&pBVar3->RelativePathTopBinary,0,
                     (char *)(pBVar3->RelativePathTopBinary)._M_string_length,0x59b99e);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        if (local_d8 != (cmStateSnapshot *)0x0) {
          operator_delete(local_d8,(long)local_c8 - (long)local_d8);
        }
        return;
      }
      if (iStack_d0._M_current != local_c8) break;
      std::vector<cmStateSnapshot,std::allocator<cmStateSnapshot>>::
      _M_realloc_insert<cmStateSnapshot_const&>
                ((vector<cmStateSnapshot,std::allocator<cmStateSnapshot>> *)&local_d8,iStack_d0,
                 &local_b8);
    }
    ((iStack_d0._M_current)->Position).Position = local_b8.Position.Position;
    *(undefined4 *)&(iStack_d0._M_current)->State = local_b8.State._0_4_;
    *(undefined4 *)((long)&(iStack_d0._M_current)->State + 4) = local_b8.State._4_4_;
    *(undefined4 *)&((iStack_d0._M_current)->Position).Tree = local_b8.Position.Tree._0_4_;
    *(undefined4 *)((long)&((iStack_d0._M_current)->Position).Tree + 4) =
         local_b8.Position.Tree._4_4_;
    iStack_d0._M_current = iStack_d0._M_current + 1;
  } while( true );
}

Assistant:

void cmStateDirectory::ComputeRelativePathTopBinary()
{
  cmStateSnapshot snapshot = this->Snapshot_;
  std::vector<cmStateSnapshot> snapshots;
  snapshots.push_back(snapshot);
  while (true) {
    snapshot = snapshot.GetBuildsystemDirectoryParent();
    if (snapshot.IsValid()) {
      snapshots.push_back(snapshot);
    } else {
      break;
    }
  }

  std::string result = snapshots.front().GetDirectory().GetCurrentBinary();

  for (std::vector<cmStateSnapshot>::const_iterator it = snapshots.begin() + 1;
       it != snapshots.end(); ++it) {
    std::string currentBinary = it->GetDirectory().GetCurrentBinary();
    if (cmSystemTools::IsSubDirectory(result, currentBinary)) {
      result = currentBinary;
    }
  }

  // The current working directory on Windows cannot be a network
  // path.  Therefore relative paths cannot work when the binary tree
  // is a network path.
  if (result.size() < 2 || result.substr(0, 2) != "//") {
    this->DirectoryState->RelativePathTopBinary = result;
  } else {
    this->DirectoryState->RelativePathTopBinary = "";
  }
}